

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

aspa_status
aspa_table_update_in_place_undo
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation *failed_operation)

{
  aspa_record *record;
  aspa_update_operation *paVar1;
  long lVar2;
  aspa_array *array;
  aspa_store_node **ppaVar3;
  ulong uVar4;
  aspa_record *paVar5;
  aspa_update_operation *paVar6;
  ulong index;
  aspa_status aVar7;
  size_t *psVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  ulong local_60;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x37b,
                  "enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x37c,
                  "enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (count != 0 && operations != (aspa_update_operation *)0x0) {
    if (operations == (aspa_update_operation *)0x0) {
      __assert_fail("operations",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x2fe,
                    "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                   );
    }
    pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
    ppaVar3 = aspa_store_get_node(&aspa_table->store,rtr_socket);
    if ((ppaVar3 == (aspa_store_node **)0x0) || (*ppaVar3 == (aspa_store_node *)0x0)) {
      aVar7 = ASPA_ERROR;
    }
    else {
      array = (*ppaVar3)->aspa_array;
      if (array == (aspa_array *)0x0) {
LAB_0010d4b3:
        aVar7 = ASPA_ERROR;
      }
      else {
        index = 0;
        for (local_60 = 0; uVar4 = (ulong)array->size, local_60 < uVar4; local_60 = local_60 + 1) {
          paVar1 = operations + local_60;
          aVar7 = ASPA_SUCCESS;
          paVar6 = (aspa_update_operation *)0x0;
          if (local_60 < count - 1) {
            paVar6 = operations + local_60 + 1;
          }
          if ((failed_operation != (aspa_update_operation *)0x0) && (paVar1 == failed_operation))
          goto LAB_0010d4c6;
          record = &paVar1->record;
          while ((index < uVar4 &&
                 (paVar5 = aspa_array_get_record(array,index),
                 paVar5->customer_asn < record->customer_asn))) {
            index = index + 1;
            uVar4 = (ulong)array->size;
          }
          paVar5 = aspa_array_get_record(array,index);
          if (paVar5 == (aspa_record *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = paVar5->customer_asn == record->customer_asn;
          }
          if (local_60 < count - 1) {
            bVar10 = operations[local_60 + 1].record.customer_asn == record->customer_asn;
          }
          else {
            bVar10 = false;
          }
          if (paVar1->type == ASPA_REMOVE) {
            if (((bool)(bVar10 & bVar9)) && (paVar6->type == ASPA_ADD)) {
              if (paVar5->provider_asns != (uint32_t *)0x0) {
                lrtr_free(paVar5->provider_asns);
              }
              paVar5->provider_asns = (paVar1->record).provider_asns;
              paVar5->provider_count = (paVar1->record).provider_count;
              aspa_table_notify_clients(aspa_table,&paVar6->record,rtr_socket,ASPA_REMOVE);
              local_60 = local_60 + 1;
            }
            else {
              if (bVar9) {
                aVar7 = ASPA_DUPLICATE_RECORD;
                goto LAB_0010d4c6;
              }
              aVar7 = aspa_array_insert(array,index,record,false);
              if (aVar7 != ASPA_SUCCESS) goto LAB_0010d4b3;
            }
            aspa_table_notify_clients(aspa_table,record,rtr_socket,ASPA_ADD);
            (paVar1->record).provider_count = 0;
            (paVar1->record).provider_asns = (uint32_t *)0x0;
          }
          else if (paVar1->type == ASPA_ADD) {
            if (!bVar9) {
LAB_0010d4bc:
              aVar7 = ASPA_RECORD_NOT_FOUND;
              goto LAB_0010d4c6;
            }
            if ((bVar10) && (paVar6->type == ASPA_REMOVE)) {
              paVar1->is_no_op = true;
              paVar6->is_no_op = true;
              local_60 = local_60 + 1;
            }
            else {
              aVar7 = aspa_array_remove(array,index,true);
              if (aVar7 != ASPA_SUCCESS) goto LAB_0010d4bc;
              aspa_table_notify_clients(aspa_table,record,rtr_socket,ASPA_REMOVE);
            }
          }
        }
        aVar7 = ASPA_SUCCESS;
      }
    }
LAB_0010d4c6:
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    psVar8 = &(operations->record).provider_count;
    while (bVar9 = count != 0, count = count - 1, bVar9) {
      if (*(char *)(psVar8 + -2) == '\0') {
        *psVar8 = 0;
        psVar8[1] = 0;
      }
      psVar8 = psVar8 + 6;
    }
  }
  else {
    aVar7 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return aVar7;
}

Assistant:

enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						 struct aspa_update_operation *operations, size_t count,
						 struct aspa_update_operation *failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);

	if (!aspa_table || !rtr_socket || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	enum aspa_status res =
		aspa_table_update_in_place_undo_internal(aspa_table, rtr_socket, operations, count, failed_operation);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *op = &operations[i];

		// If it's a remove operation, we inserted a reference to the removed record's providers.
		// Restore that 'remove' operation back to its original state.
		if (op->type == ASPA_REMOVE) {
			op->record.provider_asns = NULL;
			op->record.provider_count = 0;
		}
	}

	return res;
}